

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isShadowTableName(sqlite3 *db,char *zName)

{
  char *pcVar1;
  Table *pTVar2;
  long *plVar3;
  Module *pMod;
  Table *pTab;
  char *zTail;
  char *zName_local;
  sqlite3 *db_local;
  
  pcVar1 = strrchr(zName,0x5f);
  if (pcVar1 == (char *)0x0) {
    db_local._4_4_ = 0;
  }
  else {
    *pcVar1 = '\0';
    pTVar2 = sqlite3FindTable(db,zName,(char *)0x0);
    *pcVar1 = '_';
    if (pTVar2 == (Table *)0x0) {
      db_local._4_4_ = 0;
    }
    else if (pTVar2->nModuleArg == 0) {
      db_local._4_4_ = 0;
    }
    else {
      plVar3 = (long *)sqlite3HashFind(&db->aModule,*pTVar2->azModuleArg);
      if (plVar3 == (long *)0x0) {
        db_local._4_4_ = 0;
      }
      else if (*(int *)*plVar3 < 3) {
        db_local._4_4_ = 0;
      }
      else if (*(long *)(*plVar3 + 0xb8) == 0) {
        db_local._4_4_ = 0;
      }
      else {
        db_local._4_4_ = (**(code **)(*plVar3 + 0xb8))(pcVar1 + 1);
      }
    }
  }
  return db_local._4_4_;
}

Assistant:

static int isShadowTableName(sqlite3 *db, char *zName){
  char *zTail;                  /* Pointer to the last "_" in zName */
  Table *pTab;                  /* Table that zName is a shadow of */
  Module *pMod;                 /* Module for the virtual table */

  zTail = strrchr(zName, '_');
  if( zTail==0 ) return 0;
  *zTail = 0;
  pTab = sqlite3FindTable(db, zName, 0);
  *zTail = '_';
  if( pTab==0 ) return 0;
  if( !IsVirtual(pTab) ) return 0;
  pMod = (Module*)sqlite3HashFind(&db->aModule, pTab->azModuleArg[0]);
  if( pMod==0 ) return 0;
  if( pMod->pModule->iVersion<3 ) return 0;
  if( pMod->pModule->xShadowName==0 ) return 0;
  return pMod->pModule->xShadowName(zTail+1);
}